

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_visit_field_info.h
# Opt level: O1

void __thiscall
google::protobuf::internal::MapDynamicFieldInfo<google::protobuf::Message>::MapDynamicFieldInfo
          (MapDynamicFieldInfo<google::protobuf::Message> *this,Reflection *r,Message *m,
          FieldDescriptor *f,FieldDescriptor *key_f,FieldDescriptor *val_f,MapFieldBase *map_field)

{
  bool bVar1;
  Nonnull<const_char_*> pcVar2;
  FieldDescriptor *unaff_RBX;
  internal local_20 [16];
  
  this->reflection = r;
  this->message = m;
  this->field = f;
  this->key = key_f;
  this->value = val_f;
  this->const_map_field = map_field;
  if (f->type_ == '\v') {
    bVar1 = FieldDescriptor::is_map_message_type(f);
    unaff_RBX = val_f;
    if (!bVar1) goto LAB_00274b63;
    if (key_f != (FieldDescriptor *)0x0) {
      pcVar2 = (Nonnull<const_char_*>)0x0;
      goto LAB_00274b4a;
    }
  }
  else {
LAB_00274b63:
    internal::MapDynamicFieldInfo(local_20);
  }
  pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                     ((void *)0x0,(void *)0x0,"key_f != nullptr");
LAB_00274b4a:
  if (pcVar2 == (Nonnull<const_char_*>)0x0) {
    if (unaff_RBX == (FieldDescriptor *)0x0) {
      pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                         ((void *)0x0,(void *)0x0,"val_f != nullptr");
    }
    else {
      pcVar2 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar2 == (Nonnull<const_char_*>)0x0) {
      return;
    }
  }
  else {
    internal::MapDynamicFieldInfo();
  }
  internal::MapDynamicFieldInfo();
}

Assistant:

constexpr MapDynamicFieldInfo(const Reflection* r, MessageT& m,
                                const FieldDescriptor* f,
                                const FieldDescriptor* key_f,
                                const FieldDescriptor* val_f,
                                const MapFieldBase& map_field)
      : reflection(r),
        message(m),
        field(f),
        key(key_f),
        value(val_f),
        const_map_field(map_field) {
    ABSL_DCHECK(f->is_map());
    ABSL_DCHECK_NE(key_f, nullptr);
    ABSL_DCHECK_NE(val_f, nullptr);
  }